

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O2

void av1_model_rd_curvfit
               (BLOCK_SIZE bsize,double sse_norm,double xqr,double *rate_f,double *distbysse_f)

{
  byte bVar1;
  undefined7 in_register_00000039;
  double dVar2;
  double dVar3;
  double dVar4;
  
  if (xqr <= -14.999999) {
    xqr = -14.999999;
  }
  if (15.999999 <= xqr) {
    xqr = 15.999999;
  }
  bVar1 = ""[CONCAT71(in_register_00000039,bsize) & 0xffffffff];
  dVar4 = xqr + 15.5 + xqr + 15.5;
  dVar2 = floor(dVar4);
  dVar4 = dVar4 - (double)(int)dVar2;
  dVar3 = interp_cubic((double *)(&UNK_0045edb8 + (ulong)bVar1 * 0x208 + (long)(int)dVar2 * 8),dVar4
                      );
  *rate_f = dVar3;
  dVar2 = interp_cubic(interp_rgrid_curv[(ulong)(16.0 < sse_norm) + 3] + (long)(int)dVar2 + 0x40,
                       dVar4);
  *distbysse_f = dVar2;
  return;
}

Assistant:

void av1_model_rd_curvfit(BLOCK_SIZE bsize, double sse_norm, double xqr,
                          double *rate_f, double *distbysse_f) {
  const double x_start = -15.5;
  const double x_end = 16.5;
  const double x_step = 0.5;
  const double epsilon = 1e-6;
  const int rcat = bsize_curvfit_model_cat_lookup[bsize];
  const int dcat = sse_norm_curvfit_model_cat_lookup(sse_norm);
  (void)x_end;

  xqr = AOMMAX(xqr, x_start + x_step + epsilon);
  xqr = AOMMIN(xqr, x_end - x_step - epsilon);
  const double x = (xqr - x_start) / x_step;
  const int xi = (int)floor(x);
  const double xo = x - xi;

  assert(xi > 0);

  const double *prate = &interp_rgrid_curv[rcat][(xi - 1)];
  *rate_f = interp_cubic(prate, xo);
  const double *pdist = &interp_dgrid_curv[dcat][(xi - 1)];
  *distbysse_f = interp_cubic(pdist, xo);
}